

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O0

ssize_t __thiscall bsplib::Unbuf::recv(Unbuf *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  size_type sVar2;
  exception *this_00;
  exception *e;
  undefined1 local_200 [8];
  Entry entry;
  exception local_1d0;
  ulong local_30;
  size_t int_max;
  size_t size_local;
  void *addr_local;
  Unbuf *pUStack_10;
  int src_pid_local;
  Unbuf *this_local;
  
  int_max = __n;
  size_local = (size_t)__buf;
  addr_local._4_4_ = __fd;
  pUStack_10 = this;
  iVar1 = std::numeric_limits<int>::max();
  local_30 = (ulong)iVar1;
  sVar2 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::size
                    (&this->m_recvs);
  if (local_30 < sVar2) {
    entry.tag._3_1_ = 1;
    this_00 = (exception *)__cxa_allocate_exception(0x1a0);
    exception::exception(&local_1d0,"bsp_hpput");
    e = exception::operator<<(&local_1d0,(char (*) [21])"Too many HP messages");
    exception::exception(this_00,e);
    entry.tag._3_1_ = 0;
    __cxa_throw(this_00,&exception::typeinfo,exception::~exception);
  }
  local_200._0_4_ = addr_local._4_4_;
  entry._0_8_ = size_local;
  entry.addr = (char *)int_max;
  sVar2 = std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::size
                    (&this->m_recvs);
  entry.size._0_4_ = (int)sVar2 * 2 + 1;
  std::vector<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>::push_back
            (&this->m_recvs,(value_type *)local_200);
  return (ulong)(uint)entry.size;
}

Assistant:

int Unbuf :: recv( int src_pid, void * addr, size_t size )
{
    size_t int_max = std::numeric_limits<int>::max();
    if ( m_recvs.size() > int_max )
        throw exception("bsp_hpput") << "Too many HP messages";
 
    Entry entry = { src_pid, 
                    static_cast<char *>(addr),
                    size,
                    int (2* m_recvs.size() + 1) };
    m_recvs.push_back( entry );
    return entry.tag;
}